

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printDefun(JSPrinter *this,Ref node)

{
  size_t sVar1;
  undefined8 *puVar2;
  ulong uVar3;
  int *local_38;
  Ref args;
  Ref node_local;
  
  args = node;
  emit(this,"function ");
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&args);
  if (*(int *)*puVar2 != 0) {
LAB_00176ce6:
    __assert_fail("isString()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0xeb,"const char *cashew::Value::getCString()");
  }
  emit(this,*(char **)((int *)*puVar2 + 4));
  maybeSpace(this,'(');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '(';
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&args);
  local_38 = (int *)*puVar2;
  if (*local_38 == 2) {
    uVar3 = 0;
    do {
      if (*(ulong *)(*(long *)(local_38 + 2) + 8) <= uVar3) {
        maybeSpace(this,')');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = ')';
        space(this);
        if ((args.inst)->type != Array) break;
        if (((((args.inst)->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>)
            .usedElements != 3) {
          puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&args);
          if (*(int *)*puVar2 != 2) break;
          if (*(long *)(*(long *)((int *)*puVar2 + 2) + 8) != 0) {
            maybeSpace(this,'{');
            ensure(this,1);
            sVar1 = this->used;
            this->used = sVar1 + 1;
            this->buffer[sVar1] = '{';
            this->indent = this->indent + 1;
            newline(this);
            puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&args);
            printStats(this,(Value *)*puVar2);
            this->indent = this->indent + -1;
            newline(this);
            emit(this,'}');
            newline(this);
            return;
          }
        }
        emit(this,"{}");
        return;
      }
      if (uVar3 != 0) {
        if (this->pretty == true) {
          emit(this,", ");
        }
        else {
          maybeSpace(this,',');
          ensure(this,1);
          sVar1 = this->used;
          this->used = sVar1 + 1;
          this->buffer[sVar1] = ',';
        }
      }
      puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_38);
      if (*(int *)*puVar2 != 0) goto LAB_00176ce6;
      emit(this,*(char **)((int *)*puVar2 + 4));
      uVar3 = uVar3 + 1;
    } while (*local_38 == 2);
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x199,"size_t cashew::Value::size()");
}

Assistant:

void printDefun(Ref node) {
    emit("function ");
    emit(node[1]->getCString());
    emit('(');
    Ref args = node[2];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        (pretty ? emit(", ") : emit(','));
      }
      emit(args[i]->getCString());
    }
    emit(')');
    space();
    if (node->size() == 3 || node[3]->size() == 0) {
      emit("{}");
      return;
    }
    emit('{');
    indent++;
    newline();
    printStats(node[3]);
    indent--;
    newline();
    emit('}');
    newline();
  }